

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastcgi_api.cpp
# Opt level: O1

void __thiscall cppcms::impl::cgi::fastcgi::add_value(fastcgi *this,string *value)

{
  pointer *ppcVar1;
  ulong uVar2;
  iterator __position;
  uint uVar3;
  undefined8 in_RAX;
  undefined4 uStack_8;
  uint local_4;
  
  uVar2 = value->_M_string_length;
  if (uVar2 < 0x80) {
    local_4 = (uint)((ulong)in_RAX >> 0x20);
    uStack_8 = CONCAT13((char)uVar2,(int3)in_RAX);
    __position._M_current =
         (this->body_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->body_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<char,_std::allocator<char>_>::_M_realloc_insert<char>
                (&this->body_,__position,(char *)((long)&uStack_8 + 3));
    }
    else {
      *__position._M_current = (char)uVar2;
      ppcVar1 = &(this->body_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppcVar1 = *ppcVar1 + 1;
    }
  }
  else {
    uVar3 = (uint)uVar2;
    uStack_8 = (undefined4)in_RAX;
    _uStack_8 = CONCAT44((uVar3 | 0x80000000) >> 0x18 | (uVar3 & 0xff0000) >> 8 |
                         (uVar3 & 0xff00) << 8 | uVar3 << 0x18,uStack_8);
    std::vector<char,std::allocator<char>>::_M_range_insert<char*>
              ((vector<char,std::allocator<char>> *)&this->body_,
               (this->body_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_4);
  }
  return;
}

Assistant:

void add_value(std::string const &value)
		{
			if(value.size() <128) {
				body_.push_back(char(value.size()));
			}
			else {
				uint32_t size=value.size();
				size |= 0x80000000u;
				size=htonl(size);
				char *p=(char*)&size;
				body_.insert(body_.end(),p,p+sizeof(size));
			}
		}